

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BipedFootContactClassifier.cpp
# Opt level: O3

void __thiscall
iDynTree::BipedFootContactClassifier::updateFootContactState
          (BipedFootContactClassifier *this,double currentTime,double leftFootNormalForce,
          double rightFootNormalForce)

{
  ContactStateMachine *pCVar1;
  
  ContactStateMachine::contactMeasurementUpdate
            ((this->m_leftFootContactClassifier)._M_t.
             super___uniq_ptr_impl<iDynTree::ContactStateMachine,_std::default_delete<iDynTree::ContactStateMachine>_>
             ._M_t.
             super__Tuple_impl<0UL,_iDynTree::ContactStateMachine_*,_std::default_delete<iDynTree::ContactStateMachine>_>
             .super__Head_base<0UL,_iDynTree::ContactStateMachine_*,_false>._M_head_impl,currentTime
             ,leftFootNormalForce);
  ContactStateMachine::contactMeasurementUpdate
            ((this->m_rightFootContactClassifier)._M_t.
             super___uniq_ptr_impl<iDynTree::ContactStateMachine,_std::default_delete<iDynTree::ContactStateMachine>_>
             ._M_t.
             super__Tuple_impl<0UL,_iDynTree::ContactStateMachine_*,_std::default_delete<iDynTree::ContactStateMachine>_>
             .super__Head_base<0UL,_iDynTree::ContactStateMachine_*,_false>._M_head_impl,currentTime
             ,rightFootNormalForce);
  pCVar1 = (this->m_rightFootContactClassifier)._M_t.
           super___uniq_ptr_impl<iDynTree::ContactStateMachine,_std::default_delete<iDynTree::ContactStateMachine>_>
           ._M_t.
           super__Tuple_impl<0UL,_iDynTree::ContactStateMachine_*,_std::default_delete<iDynTree::ContactStateMachine>_>
           .super__Head_base<0UL,_iDynTree::ContactStateMachine_*,_false>._M_head_impl;
  this->m_leftFootContactState =
       ((this->m_leftFootContactClassifier)._M_t.
        super___uniq_ptr_impl<iDynTree::ContactStateMachine,_std::default_delete<iDynTree::ContactStateMachine>_>
        ._M_t.
        super__Tuple_impl<0UL,_iDynTree::ContactStateMachine_*,_std::default_delete<iDynTree::ContactStateMachine>_>
        .super__Head_base<0UL,_iDynTree::ContactStateMachine_*,_false>._M_head_impl)->m_currentState
  ;
  this->m_rightFootContactState = pCVar1->m_currentState;
  detectFeetTransition(this);
  return;
}

Assistant:

void BipedFootContactClassifier::updateFootContactState(double currentTime, double leftFootNormalForce, double rightFootNormalForce)
{
    m_leftFootContactClassifier.get()->contactMeasurementUpdate(currentTime, leftFootNormalForce);
    m_rightFootContactClassifier.get()->contactMeasurementUpdate(currentTime, rightFootNormalForce);
    m_leftFootContactState = m_leftFootContactClassifier.get()->contactState();
    m_rightFootContactState = m_rightFootContactClassifier.get()->contactState();
    
    detectFeetTransition();
}